

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

WalletTx * __thiscall
wallet::anon_unknown_5::WalletImpl::getWalletTxDetails
          (WalletImpl *this,uint256 *txid,WalletTxStatus *tx_status,WalletOrderForm *order_form,
          bool *in_mempool,int *num_blocks)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  WalletTx *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  CWalletTx *unaff_retaddr;
  CWallet *in_stack_00000008;
  iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  CWalletTx *in_stack_ffffffffffffff08;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_ffffffffffffff10;
  CWallet *in_stack_ffffffffffffff18;
  CWalletTx *in_stack_ffffffffffffff20;
  CWallet *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff48;
  pointer local_40;
  pointer ppStack_38;
  pointer local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff08);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff08);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff08);
  _GLOBAL__N_1::std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::find(in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff08);
  _GLOBAL__N_1::std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end(in_stack_ffffffffffffff10);
  bVar2 = _GLOBAL__N_1::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_ffffffffffffff18,
                     (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_ffffffffffffff10);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff08);
    memset(&in_RDI->txin_is_mine,0,0x18);
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::vector
              ((vector<wallet::isminetype,_std::allocator<wallet::isminetype>_> *)
               in_stack_ffffffffffffff08);
    memset(&in_RDI->txout_is_mine,0,0x18);
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::vector
              ((vector<wallet::isminetype,_std::allocator<wallet::isminetype>_> *)
               in_stack_ffffffffffffff08);
    memset(&in_RDI->txout_is_change,0,0x28);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff08);
    memset(&in_RDI->txout_address,0,0x18);
    _GLOBAL__N_1::std::
    vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::vector((vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
              *)in_stack_ffffffffffffff08);
    memset(&in_RDI->txout_address_is_mine,0,0x18);
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::vector
              ((vector<wallet::isminetype,_std::allocator<wallet::isminetype>_> *)
               in_stack_ffffffffffffff08);
    in_RDI->credit = 0;
    in_RDI->debit = 0;
    in_RDI->change = 0;
    in_RDI->time = 0;
    memset(&in_RDI->value_map,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&in_stack_ffffffffffffff08->mapValue);
    in_RDI->is_coinbase = false;
  }
  else {
    _GLOBAL__N_1::std::
    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff08);
    iVar3 = CWallet::GetLastBlockHeight(in_stack_ffffffffffffff18);
    *(int *)&(in_stack_00000008->super_WalletStorage)._vptr_WalletStorage = iVar3;
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_ffffffffffffff08);
    bVar2 = CWalletTx::InMempool(in_stack_ffffffffffffff08);
    *(bool *)in_R9 = bVar2;
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_ffffffffffffff08);
    _GLOBAL__N_1::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(in_RDX,in_RCX);
    _GLOBAL__N_1::std::
    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff18);
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_ffffffffffffff08);
    MakeWalletTxStatus(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    (in_RCX->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_30;
    (in_RCX->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = local_40;
    (in_RCX->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppStack_38;
    _GLOBAL__N_1::std::
    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff18);
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_ffffffffffffff08);
    MakeWalletTx(in_stack_00000008,unaff_retaddr);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

WalletTx getWalletTxDetails(const uint256& txid,
        WalletTxStatus& tx_status,
        WalletOrderForm& order_form,
        bool& in_mempool,
        int& num_blocks) override
    {
        LOCK(m_wallet->cs_wallet);
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi != m_wallet->mapWallet.end()) {
            num_blocks = m_wallet->GetLastBlockHeight();
            in_mempool = mi->second.InMempool();
            order_form = mi->second.vOrderForm;
            tx_status = MakeWalletTxStatus(*m_wallet, mi->second);
            return MakeWalletTx(*m_wallet, mi->second);
        }
        return {};
    }